

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::genTestRects
               (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *rects,int width,
               int height)

{
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *this;
  Vector<int,_4> local_34;
  int local_24;
  int local_20;
  int ndx;
  int curHeight;
  int curWidth;
  int height_local;
  int width_local;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *rects_local;
  
  local_24 = 0;
  local_20 = height;
  ndx = width;
  curHeight = height;
  curWidth = width;
  _height_local = rects;
  while( true ) {
    this = _height_local;
    tcu::Vector<int,_4>::Vector(&local_34,curWidth - ndx,curHeight - local_20,ndx,local_20);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
              (this,&local_34);
    if ((ndx == 1) && (local_20 == 1)) break;
    if ((local_20 < 2) || ((local_24 % 2 != 0 && (ndx != 1)))) {
      ndx = ndx + -1;
    }
    else {
      local_20 = local_20 + -1;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

static void genTestRects (vector<IVec4>& rects, int width, int height)
{
	int curWidth	= width;
	int curHeight	= height;
	int ndx			= 0;

	for (;;)
	{
		rects.push_back(IVec4(width-curWidth, height-curHeight, curWidth, curHeight));

		DE_ASSERT(curWidth >= 1 && curHeight >= 1);
		if (curWidth == 1 && curHeight == 1)
			break;
		else if (curHeight > 1 && ((ndx%2) == 0 || curWidth == 1))
			curHeight -= 1;
		else
			curWidth -= 1;

		ndx += 1;
	}
}